

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O0

xcb_generic_iterator_t
xcb_input_get_device_button_mapping_map_end(xcb_input_get_device_button_mapping_reply_t *R)

{
  void *pvVar1;
  xcb_generic_iterator_t xVar2;
  long lVar3;
  long in_RDI;
  long in_FS_OFFSET;
  xcb_generic_iterator_t i;
  undefined4 local_20;
  undefined4 local_18;
  
  pvVar1 = (void *)(in_RDI + 0x20 + (ulong)*(byte *)(in_RDI + 8));
  local_18 = (int)pvVar1;
  local_20 = (int)in_RDI;
  lVar3 = (ulong)(uint)(local_18 - local_20) << 0x20;
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    xVar2.rem = (int)lVar3;
    xVar2.index = (int)((ulong)lVar3 >> 0x20);
    xVar2.data = pvVar1;
    return xVar2;
  }
  __stack_chk_fail();
}

Assistant:

xcb_generic_iterator_t
xcb_input_get_device_button_mapping_map_end (const xcb_input_get_device_button_mapping_reply_t *R)
{
    xcb_generic_iterator_t i;
    i.data = ((uint8_t *) (R + 1)) + (R->map_size);
    i.rem = 0;
    i.index = (char *) i.data - (char *) R;
    return i;
}